

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

string * __thiscall
helics::RandomDropFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDropFilterOperation *this,string_view property)

{
  if (property._M_len == 4) {
    if ((int)*(long *)property._M_str == 0x626f7270) goto LAB_0022251e;
  }
  else if ((property._M_len == 8) && (*(long *)property._M_str == 0x626f7270706f7264)) {
LAB_0022251e:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",
               (this->dropProb).super___atomic_float<double>._M_fp);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDropFilterOperation::getString(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return std::to_string(dropProb.load());
    }
    return FilterOperations::getString(property);
}